

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O2

type unodb::qsbr_state::atomic_fetch_dec_threads_in_previous_epoch(atomic<unsigned_long> *word)

{
  type word_00;
  qsbr_thread_count_type qVar1;
  
  LOCK();
  word_00 = (word->super___atomic_base<unsigned_long>)._M_i;
  (word->super___atomic_base<unsigned_long>)._M_i =
       (word->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  qVar1 = get_threads_in_previous_epoch(word_00);
  if (qVar1 != 0) {
    assert_invariants(word_00);
    return word_00;
  }
  __assert_fail("get_threads_in_previous_epoch(old_word) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                ,0x66,
                "static qsbr_state::type unodb::qsbr_state::atomic_fetch_dec_threads_in_previous_epoch(std::atomic<qsbr_state::type> &)"
               );
}

Assistant:

[[nodiscard]] qsbr_state::type
qsbr_state::atomic_fetch_dec_threads_in_previous_epoch(
    std::atomic<qsbr_state::type> &word) noexcept {
  const auto old_word = word.fetch_sub(1, std::memory_order_acq_rel);

  UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(old_word) > 0);
  assert_invariants(old_word);

  return old_word;
}